

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QItemSelection * __thiscall
QListViewPrivate::selection
          (QItemSelection *__return_storage_ptr__,QListViewPrivate *this,QRect *rect)

{
  QModelIndex *pQVar1;
  QModelIndex *pQVar2;
  long in_FS_OFFSET;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  QArrayDataPointer<QModelIndex> local_88;
  QModelIndex local_68;
  QModelIndex local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
  local_48.r = -1;
  local_48.c = -1;
  local_68.r = -1;
  local_68.c = -1;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
  (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
  local_48.i = 0;
  local_48.m.ptr = (QAbstractItemModel *)0x0;
  local_68.i = 0;
  local_68.m.ptr = (QAbstractItemModel *)0x0;
  local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  intersectingSet((QList<QModelIndex> *)&local_88,this,rect,true);
  pQVar1 = local_88.ptr;
  pQVar2 = local_88.ptr;
  while( true ) {
    bVar3 = -1 < (local_48.c | local_48.r);
    if (pQVar2 == pQVar1 + local_88.size) break;
    if ((local_48.m.ptr != (QAbstractItemModel *)0x0 && bVar3) ||
       (((-1 < local_68.r && (-1 < (long)local_68._0_8_)) &&
        (local_68.m.ptr != (QAbstractItemModel *)0x0)))) {
      if (pQVar2->r == local_48.r - 1U) {
        local_48.m.ptr = (pQVar2->m).ptr;
        local_48.r = pQVar2->r;
        local_48.c = pQVar2->c;
        uVar5 = (undefined4)pQVar2->i;
        uVar6 = *(undefined4 *)((long)&pQVar2->i + 4);
        goto LAB_00515068;
      }
      if (pQVar2->r == local_68.r + 1U) {
        local_68.m.ptr = (pQVar2->m).ptr;
        local_68.r = pQVar2->r;
        local_68.c = pQVar2->c;
        local_68.i = pQVar2->i;
      }
      else {
        QItemSelection::select((QModelIndex *)__return_storage_ptr__,&local_48);
        local_68.m.ptr = (pQVar2->m).ptr;
        local_68.r = pQVar2->r;
        local_68.c = pQVar2->c;
        local_68.i = pQVar2->i;
        local_48.r = pQVar2->r;
        local_48.c = pQVar2->c;
        local_48.i = pQVar2->i;
        local_48.m.ptr = (pQVar2->m).ptr;
        pQVar1 = local_88.ptr;
      }
    }
    else {
      local_68.m.ptr = (pQVar2->m).ptr;
      local_68.r = pQVar2->r;
      local_68.c = pQVar2->c;
      local_68.i = pQVar2->i;
      local_48.r = pQVar2->r;
      local_48.c = pQVar2->c;
      uVar5 = (undefined4)pQVar2->i;
      uVar6 = *(undefined4 *)((long)&pQVar2->i + 4);
      local_48.m.ptr = (pQVar2->m).ptr;
LAB_00515068:
      local_48.i = CONCAT44(uVar6,uVar5);
    }
    pQVar2 = pQVar2 + 1;
  }
  bVar4 = (local_68.c | local_68.r) < 0;
  if (local_48.m.ptr != (QAbstractItemModel *)0x0 && bVar3) {
    if (local_68.m.ptr == (QAbstractItemModel *)0x0 || bVar4) {
      pQVar1 = &local_48;
    }
    else {
      pQVar1 = &local_48;
    }
  }
  else {
    if (local_68.m.ptr == (QAbstractItemModel *)0x0 || bVar4) goto LAB_005150fb;
    pQVar1 = &local_68;
  }
  QItemSelection::select((QModelIndex *)__return_storage_ptr__,pQVar1);
LAB_005150fb:
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QItemSelection QListViewPrivate::selection(const QRect &rect) const
{
    QItemSelection selection;
    QModelIndex tl, br;
    const QList<QModelIndex> intersectVector = intersectingSet(rect);
    QList<QModelIndex>::const_iterator it = intersectVector.begin();
    for (; it != intersectVector.end(); ++it) {
        if (!tl.isValid() && !br.isValid()) {
            tl = br = *it;
        } else if ((*it).row() == (tl.row() - 1)) {
            tl = *it; // expand current range
        } else if ((*it).row() == (br.row() + 1)) {
            br = (*it); // expand current range
        } else {
            selection.select(tl, br); // select current range
            tl = br = *it; // start new range
        }
    }

    if (tl.isValid() && br.isValid())
        selection.select(tl, br);
    else if (tl.isValid())
        selection.select(tl, tl);
    else if (br.isValid())
        selection.select(br, br);

    return selection;
}